

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O2

value_type_conflict1 __thiscall
CCDPP_MPI::update_rating
          (CCDPP_MPI *this,
          unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          *_R,value_type_conflict1 *_q4d,value_type_conflict1 *_global_p4d,int start_q_id,
          int workload,bool add)

{
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *this_00;
  int iVar1;
  double dVar2;
  int size;
  value_type_conflict1 flag;
  vector<double,_std::allocator<double>_> loss;
  int local_d4;
  int local_d0;
  int local_cc;
  value_type_conflict1 local_c8;
  _Vector_base<double,_std::allocator<double>_> local_c0;
  value_type_conflict1 *local_a8;
  value_type_conflict1 *local_a0;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:85:45)_(int)>
  local_98;
  function0<void> local_50;
  
  local_d4 = (int)(_R->_M_h)._M_element_count;
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_d0 = workload;
  local_cc = start_q_id;
  local_a8 = _global_p4d;
  local_a0 = _q4d;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_c0,
             (long)this->parameter->num_of_thread,(value_type_conflict1 *)&local_50,
             (allocator_type *)&local_c8);
  local_c8 = (value_type_conflict1)
             ((ulong)add * 0x3ff0000000000000 + (ulong)!add * -0x4010000000000000);
  for (iVar1 = 0; this_00 = this->thread_pool, iVar1 < this->parameter->num_of_thread;
      iVar1 = iVar1 + 1) {
    local_98._M_f.workload = &local_d0;
    local_98._M_f.size = &local_d4;
    local_98._M_f.start_q_id = &local_cc;
    local_98._M_f.flag = &local_c8;
    local_98._M_f._q4d = &local_a0;
    local_98._M_f._global_p4d = &local_a8;
    local_98._M_f.loss = (vector<double,_std::allocator<double>_> *)&local_c0;
    local_98._M_f._R = _R;
    local_98._M_bound_args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_int>)(_Tuple_impl<0UL,_int>)iVar1;
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:85:45)_(int)>_>
              (&local_50,&local_98,0);
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(this_00,&local_50);
    boost::function0<void>::~function0(&local_50);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait(this_00,(void *)0x0);
  dVar2 = 0.0;
  for (; local_c0._M_impl.super__Vector_impl_data._M_start !=
         local_c0._M_impl.super__Vector_impl_data._M_finish;
      local_c0._M_impl.super__Vector_impl_data._M_start =
           local_c0._M_impl.super__Vector_impl_data._M_start + 1) {
    dVar2 = dVar2 + *local_c0._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c0);
  return dVar2;
}

Assistant:

inline value_type update_rating(unordered_map<int, vector<pair<int, value_type > > > &_R, value_type *_q4d, value_type *_global_p4d,
                  const int start_q_id, const int workload, bool add) {

        int size = _R.size();

        vector<value_type> loss(parameter->num_of_thread, 0);

        value_type flag = add ? 1 : -1;

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, size);

                for (int q_index = start; q_index < end; q_index++) {
                    vector<pair<int, value_type > > &vec = _R[q_index + start_q_id];
                    for (int i = 0; i < vec.size(); i++) {
                        pair<int, value_type > &p =  vec[i];
                        p.second += flag * _q4d[q_index] * _global_p4d[p.first];
                        loss[thread_index] += p.second * p.second;
                    }
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type total_loss = 0;
        for (auto l:loss) {
            total_loss += l;
        }
        return total_loss;
    }